

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ImVec2 *pIVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  uint uVar8;
  ImGuiContext *pIVar9;
  ImVec2 *pIVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  pIVar9 = GImGui;
  if (0xffffff < col) {
    fVar2 = a->x;
    fVar3 = a->y;
    iVar13 = (this->_Path).Size;
    iVar4 = (this->_Path).Capacity;
    if (iVar13 == iVar4) {
      iVar13 = iVar13 + 1;
      if (iVar4 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar4 / 2 + iVar4;
      }
      if (iVar13 < iVar11) {
        iVar13 = iVar11;
      }
      if (iVar4 < iVar13) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar10 = (ImVec2 *)(*(pIVar9->IO).MemAllocFn)((long)iVar13 << 3);
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          memcpy(pIVar10,pIVar5,(long)(this->_Path).Size << 3);
        }
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar5);
        (this->_Path).Data = pIVar10;
        (this->_Path).Capacity = iVar13;
      }
    }
    iVar13 = (this->_Path).Size;
    (this->_Path).Size = iVar13 + 1;
    IVar7.y = fVar3 + 0.5;
    IVar7.x = fVar2 + 0.5;
    (this->_Path).Data[iVar13] = IVar7;
    pIVar9 = GImGui;
    fVar2 = b->x;
    fVar3 = b->y;
    iVar13 = (this->_Path).Size;
    iVar4 = (this->_Path).Capacity;
    if (iVar13 == iVar4) {
      iVar13 = iVar13 + 1;
      if (iVar4 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar4 / 2 + iVar4;
      }
      if (iVar13 < iVar11) {
        iVar13 = iVar11;
      }
      if (iVar4 < iVar13) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar10 = (ImVec2 *)(*(pIVar9->IO).MemAllocFn)((long)iVar13 << 3);
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          memcpy(pIVar10,pIVar5,(long)(this->_Path).Size << 3);
        }
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar5);
        (this->_Path).Data = pIVar10;
        (this->_Path).Capacity = iVar13;
      }
    }
    iVar13 = (this->_Path).Size;
    (this->_Path).Size = iVar13 + 1;
    IVar6.y = fVar3 + 0.5;
    IVar6.x = fVar2 + 0.5;
    (this->_Path).Data[iVar13] = IVar6;
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,thickness,true);
    pIVar9 = GImGui;
    iVar13 = (this->_Path).Capacity;
    if (iVar13 < 0) {
      uVar12 = iVar13 / 2 + iVar13;
      uVar8 = 0;
      if (0 < (int)uVar12) {
        uVar8 = uVar12;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar10 = (ImVec2 *)(*(pIVar9->IO).MemAllocFn)((ulong)uVar8 * 8);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar10,pIVar5,(long)(this->_Path).Size << 3);
      }
      pIVar5 = (this->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar5);
      (this->_Path).Data = pIVar10;
      (this->_Path).Capacity = uVar8;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}